

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O1

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)

{
  void *pvVar1;
  int *piVar2;
  long lVar3;
  
  if (S != (SUNLinearSolver)0x0) {
    if (S->content != (void *)0x0) {
      if (*(long *)((long)S->content + 0x80) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x80) = 0;
      }
      if (*(long *)((long)S->content + 0x90) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)S->content + 0x90) = 0;
      }
      lVar3 = *(long *)((long)S->content + 0x60);
      if (lVar3 != 0) {
        N_VDestroyVectorArray(lVar3,*S->content + 1);
        *(undefined8 *)((long)S->content + 0x60) = 0;
      }
      lVar3 = *(long *)((long)S->content + 0x68);
      if (lVar3 != 0) {
        N_VDestroyVectorArray(lVar3,*S->content + 1);
        *(undefined8 *)((long)S->content + 0x68) = 0;
      }
      if (*(long *)((long)S->content + 0x70) != 0) {
        piVar2 = (int *)S->content;
        if (-1 < *piVar2) {
          lVar3 = -1;
          do {
            pvVar1 = *(void **)(*(long *)(piVar2 + 0x1c) + 8 + lVar3 * 8);
            if (pvVar1 != (void *)0x0) {
              free(pvVar1);
              *(undefined8 *)(*(long *)((long)S->content + 0x70) + 8 + lVar3 * 8) = 0;
            }
            piVar2 = (int *)S->content;
            lVar3 = lVar3 + 1;
          } while (lVar3 < *piVar2);
        }
        free(*(void **)(piVar2 + 0x1c));
        *(undefined8 *)((long)S->content + 0x70) = 0;
      }
      pvVar1 = *(void **)((long)S->content + 0x78);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)S->content + 0x78) = 0;
      }
      pvVar1 = *(void **)((long)S->content + 0x88);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)S->content + 0x88) = 0;
      }
      pvVar1 = *(void **)((long)S->content + 0x98);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)S->content + 0x98) = 0;
      }
      pvVar1 = *(void **)((long)S->content + 0xa0);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)S->content + 0xa0) = 0;
      }
      free(S->content);
      S->content = (void *)0x0;
    }
    if (S->ops != (SUNLinearSolver_Ops)0x0) {
      free(S->ops);
      S->ops = (SUNLinearSolver_Ops)0x0;
    }
    free(S);
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolFree_SPFGMR(SUNLinearSolver S)
{
  int k;

  if (S == NULL) { return SUN_SUCCESS; }

  if (S->content)
  {
    /* delete items from within the content structure */
    if (SPFGMR_CONTENT(S)->xcor)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->xcor);
      SPFGMR_CONTENT(S)->xcor = NULL;
    }
    if (SPFGMR_CONTENT(S)->vtemp)
    {
      N_VDestroy(SPFGMR_CONTENT(S)->vtemp);
      SPFGMR_CONTENT(S)->vtemp = NULL;
    }
    if (SPFGMR_CONTENT(S)->V)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->V, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->V = NULL;
    }
    if (SPFGMR_CONTENT(S)->Z)
    {
      N_VDestroyVectorArray(SPFGMR_CONTENT(S)->Z, SPFGMR_CONTENT(S)->maxl + 1);
      SPFGMR_CONTENT(S)->Z = NULL;
    }
    if (SPFGMR_CONTENT(S)->Hes)
    {
      for (k = 0; k <= SPFGMR_CONTENT(S)->maxl; k++)
      {
        if (SPFGMR_CONTENT(S)->Hes[k])
        {
          free(SPFGMR_CONTENT(S)->Hes[k]);
          SPFGMR_CONTENT(S)->Hes[k] = NULL;
        }
      }
      free(SPFGMR_CONTENT(S)->Hes);
      SPFGMR_CONTENT(S)->Hes = NULL;
    }
    if (SPFGMR_CONTENT(S)->givens)
    {
      free(SPFGMR_CONTENT(S)->givens);
      SPFGMR_CONTENT(S)->givens = NULL;
    }
    if (SPFGMR_CONTENT(S)->yg)
    {
      free(SPFGMR_CONTENT(S)->yg);
      SPFGMR_CONTENT(S)->yg = NULL;
    }
    if (SPFGMR_CONTENT(S)->cv)
    {
      free(SPFGMR_CONTENT(S)->cv);
      SPFGMR_CONTENT(S)->cv = NULL;
    }
    if (SPFGMR_CONTENT(S)->Xv)
    {
      free(SPFGMR_CONTENT(S)->Xv);
      SPFGMR_CONTENT(S)->Xv = NULL;
    }
    free(S->content);
    S->content = NULL;
  }
  if (S->ops)
  {
    free(S->ops);
    S->ops = NULL;
  }
  free(S);
  S = NULL;
  return SUN_SUCCESS;
}